

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O0

void Sfm_NtkUpdate(Sfm_Ntk_t *p,int iNode,int f,int iFaninNew,word uTruth)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *vCnf;
  int local_2c;
  int RetValue;
  int iFanin;
  word uTruth_local;
  int local_18;
  int iFaninNew_local;
  int f_local;
  int iNode_local;
  Sfm_Ntk_t *p_local;
  
  local_2c = Sfm_ObjFanin(p,iNode,f);
  iVar1 = Sfm_ObjIsNode(p,iNode);
  if (iVar1 == 0) {
    __assert_fail("Sfm_ObjIsNode(p, iNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmNtk.c"
                  ,0x141,"void Sfm_NtkUpdate(Sfm_Ntk_t *, int, int, int, word)");
  }
  if (local_2c == iFaninNew) {
    __assert_fail("iFanin != iFaninNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmNtk.c"
                  ,0x142,"void Sfm_NtkUpdate(Sfm_Ntk_t *, int, int, int, word)");
  }
  iVar1 = Sfm_ObjFaninNum(p,iNode);
  if (6 < iVar1) {
    __assert_fail("Sfm_ObjFaninNum(p, iNode) <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmNtk.c"
                  ,0x143,"void Sfm_NtkUpdate(Sfm_Ntk_t *, int, int, int, word)");
  }
  if ((uTruth == 0) || (uTruth == 0xffffffffffffffff)) {
    for (local_18 = 0; iVar1 = Sfm_ObjFaninNum(p,iNode), local_18 < iVar1; local_18 = local_18 + 1)
    {
      local_2c = Sfm_ObjFanin(p,iNode,local_18);
      pVVar2 = Sfm_ObjFoArray(p,local_2c);
      iVar1 = Vec_IntRemove(pVVar2,iNode);
      if (iVar1 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmNtk.c"
                      ,0x148,"void Sfm_NtkUpdate(Sfm_Ntk_t *, int, int, int, word)");
      }
      Sfm_NtkDeleteObj_rec(p,local_2c);
    }
    pVVar2 = Sfm_ObjFiArray(p,iNode);
    Vec_IntClear(pVVar2);
  }
  else {
    Sfm_NtkRemoveFanin(p,iNode,local_2c);
    Sfm_NtkAddFanin(p,iNode,iFaninNew);
    Sfm_NtkDeleteObj_rec(p,local_2c);
  }
  Sfm_NtkUpdateLevel_rec(p,iNode);
  if (iFaninNew != -1) {
    Sfm_NtkUpdateLevelR_rec(p,iFaninNew);
  }
  iVar1 = Sfm_ObjFanoutNum(p,local_2c);
  if (0 < iVar1) {
    Sfm_NtkUpdateLevelR_rec(p,local_2c);
  }
  Vec_WrdWriteEntry(p->vTruths,iNode,uTruth);
  iVar1 = Sfm_ObjFaninNum(p,iNode);
  pVVar2 = p->vCover;
  vCnf = Vec_WecEntry(p->vCnfs,iNode);
  Sfm_TruthToCnf(uTruth,(word *)0x0,iVar1,pVVar2,(Vec_Str_t *)vCnf);
  return;
}

Assistant:

void Sfm_NtkUpdate( Sfm_Ntk_t * p, int iNode, int f, int iFaninNew, word uTruth )
{
    int iFanin = Sfm_ObjFanin( p, iNode, f );
    assert( Sfm_ObjIsNode(p, iNode) );
    assert( iFanin != iFaninNew );
    assert( Sfm_ObjFaninNum(p, iNode) <= 6 );
    if ( uTruth == 0 || ~uTruth == 0 )
    {
        Sfm_ObjForEachFanin( p, iNode, iFanin, f )
        {
            int RetValue = Vec_IntRemove( Sfm_ObjFoArray(p, iFanin), iNode );  assert( RetValue );
            Sfm_NtkDeleteObj_rec( p, iFanin );
        }
        Vec_IntClear( Sfm_ObjFiArray(p, iNode) );
    }
    else
    {
        // replace old fanin by new fanin
        Sfm_NtkRemoveFanin( p, iNode, iFanin );
        Sfm_NtkAddFanin( p, iNode, iFaninNew );
        // recursively remove MFFC
        Sfm_NtkDeleteObj_rec( p, iFanin );
    }
    // update logic level
    Sfm_NtkUpdateLevel_rec( p, iNode );
    if ( iFaninNew != -1 )
        Sfm_NtkUpdateLevelR_rec( p, iFaninNew );
    if ( Sfm_ObjFanoutNum(p, iFanin) > 0 )
        Sfm_NtkUpdateLevelR_rec( p, iFanin );
    // update truth table
    Vec_WrdWriteEntry( p->vTruths, iNode, uTruth );
    Sfm_TruthToCnf( uTruth, NULL, Sfm_ObjFaninNum(p, iNode), p->vCover, (Vec_Str_t *)Vec_WecEntry(p->vCnfs, iNode) );
}